

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecXor.c
# Opt level: O2

Acec_Box_t * Acec_ProduceBox(Gia_Man_t *p,int fVerbose)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  abctime aVar4;
  Vec_Int_t *vAdds;
  Vec_Int_t *pVVar5;
  Vec_Int_t *vRanks;
  Vec_Int_t *vXorRoots;
  Vec_Wec_t *vXorLeaves;
  Acec_Box_t *pBox;
  int **ppiVar6;
  char *p_00;
  long lVar7;
  Vec_Int_t *vXors;
  Acec_Box_t *local_48;
  abctime local_40;
  Vec_Wec_t *vAddBoxes;
  
  aVar4 = Abc_Clock();
  vAdds = Ree_ManComputeCuts(p,&vXors,0);
  pVVar5 = Acec_FindXorRoots(p,vXors);
  vRanks = Acec_RankTrees(p,vXors,pVVar5);
  vAddBoxes = (Vec_Wec_t *)0x0;
  p_00 = (char *)p;
  Gia_ManLevelNum(p);
  local_48 = (Acec_Box_t *)CONCAT44(local_48._4_4_,fVerbose);
  if (fVerbose != 0) {
    uVar2 = Ree_ManCountFadds(vAdds);
    iVar1 = vAdds->nSize;
    local_40 = aVar4;
    iVar3 = Ree_ManCountFadds(vAdds);
    p_00 = "Detected %d full-adders and %d half-adders.  Found %d XOR-cuts.  ";
    printf("Detected %d full-adders and %d half-adders.  Found %d XOR-cuts.  ",(ulong)uVar2,
           (ulong)(uint)(iVar1 / 6 - iVar3),(long)vXors->nSize / 4 & 0xffffffff);
    aVar4 = Abc_Clock();
    lVar7 = aVar4 - local_40;
    Abc_Print((int)p_00,"%s =","Time");
    Abc_Print((int)p_00,"%9.2f sec\n",(double)lVar7 / 1000000.0);
  }
  vXorRoots = Acec_OrderTreeRoots((Gia_Man_t *)p_00,vAdds,pVVar5,vRanks);
  Vec_IntFree(pVVar5);
  Vec_IntFree(vRanks);
  pVVar5 = Acec_RankTrees(p,vXors,vXorRoots);
  vXorLeaves = Acec_FindXorLeaves(p,vXors,vAdds,vXorRoots,pVVar5,&vAddBoxes);
  Vec_IntFree(pVVar5);
  Acec_TreeVerifyConnections(p,vAdds,vAddBoxes);
  pBox = Acec_FindBox(p,vAdds,vAddBoxes,vXorLeaves,vXorRoots);
  if ((int)local_48 != 0) {
    Acec_TreePrintBox(pBox,vAdds);
  }
  local_48 = pBox;
  Vec_IntFree(vXorRoots);
  pVVar5 = vXorLeaves->pArray;
  iVar1 = vXorLeaves->nCap;
  ppiVar6 = &pVVar5->pArray;
  for (lVar7 = 0; lVar7 < iVar1; lVar7 = lVar7 + 1) {
    if (*ppiVar6 != (int *)0x0) {
      free(*ppiVar6);
      *ppiVar6 = (int *)0x0;
    }
    ppiVar6 = ppiVar6 + 2;
  }
  free(pVVar5);
  free(vXorLeaves);
  Vec_IntFree(vXors);
  Vec_IntFree(vAdds);
  return local_48;
}

Assistant:

Acec_Box_t * Acec_ProduceBox( Gia_Man_t * p, int fVerbose )
{
    extern void Acec_TreeVerifyConnections( Gia_Man_t * p, Vec_Int_t * vAdds, Vec_Wec_t * vBoxes );

    abctime clk = Abc_Clock();
    Acec_Box_t * pBox = NULL;
    Vec_Int_t * vXors, * vAdds = Ree_ManComputeCuts( p, &vXors, 0 );
    Vec_Int_t * vTemp, * vXorRoots = Acec_FindXorRoots( p, vXors ); 
    Vec_Int_t * vRanks = Acec_RankTrees( p, vXors, vXorRoots ); 
    Vec_Wec_t * vXorLeaves, * vAddBoxes = NULL; 

    Gia_ManLevelNum(p);

    //Acec_CheckXors( p, vXors );

    //Ree_ManPrintAdders( vAdds, 1 );
    if ( fVerbose )
        printf( "Detected %d full-adders and %d half-adders.  Found %d XOR-cuts.  ", Ree_ManCountFadds(vAdds), Vec_IntSize(vAdds)/6-Ree_ManCountFadds(vAdds), Vec_IntSize(vXors)/4 );
    if ( fVerbose )
        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );

    vXorRoots = Acec_OrderTreeRoots( p, vAdds, vTemp = vXorRoots, vRanks );
    Vec_IntFree( vTemp );
    Vec_IntFree( vRanks );

    vRanks = Acec_RankTrees( p, vXors, vXorRoots ); 
    vXorLeaves = Acec_FindXorLeaves( p, vXors, vAdds, vXorRoots, vRanks, &vAddBoxes ); 
    Vec_IntFree( vRanks );

    //printf( "XOR roots after reordering: \n" );
    //Vec_IntPrint( vXorRoots );
    //printf( "XOR leaves: \n" );
    //Vec_WecPrint( vXorLeaves, 0 );
    //printf( "Adder boxes: \n" );
    //Vec_WecPrint( vAddBoxes, 0 );

    Acec_TreeVerifyConnections( p, vAdds, vAddBoxes );

    pBox = Acec_FindBox( p, vAdds, vAddBoxes, vXorLeaves, vXorRoots );
    //Vec_WecFree( vAddBoxes );

    if ( fVerbose )
        Acec_TreePrintBox( pBox, vAdds );

    Vec_IntFree( vXorRoots );
    Vec_WecFree( vXorLeaves );

    Vec_IntFree( vXors );
    Vec_IntFree( vAdds );

    return pBox;
}